

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void inven_drop(object *obj,wchar_t amt)

{
  loc_conflict grid;
  _Bool _Var1;
  object *local_a0;
  ushort local_92;
  object *poStack_90;
  uint16_t total;
  object *desc_target;
  object *first;
  char local_78 [7];
  char label;
  char name [80];
  _Bool quiver;
  _Bool equipped;
  object *poStack_20;
  _Bool none_left;
  object *dropped;
  object *poStack_10;
  wchar_t amt_local;
  object *obj_local;
  
  name[0x4f] = '\0';
  name[0x4e] = '\0';
  if ((L'\0' < amt) &&
     (dropped._4_4_ = amt, poStack_10 = obj, _Var1 = object_is_carried(player,obj), _Var1)) {
    first._7_1_ = gear_to_label(player,poStack_10);
    name[0x4d] = object_is_in_quiver(player,poStack_10);
    if ((int)(uint)poStack_10->number < dropped._4_4_) {
      dropped._4_4_ = (wchar_t)poStack_10->number;
    }
    _Var1 = object_is_equipped(player->body,poStack_10);
    if (_Var1) {
      name[0x4e] = '\x01';
      inven_takeoff(poStack_10);
    }
    poStack_20 = gear_object_for_use(player,poStack_10,dropped._4_4_,false,(_Bool *)(name + 0x4f));
    object_desc(local_78,0x50,poStack_20,0x43,player);
    msg("You drop %s (%c).",local_78,(ulong)(uint)(int)first._7_1_);
    if (poStack_20->artifact == (artifact *)0x0) {
      if (((((name[0x4e] & 1U) != 0) || (_Var1 = tval_can_have_charges(poStack_10), _Var1)) ||
          (_Var1 = tval_is_rod(poStack_10), _Var1)) || (0 < poStack_10->timeout)) {
        desc_target = (object *)0x0;
        if ((name[0x4f] & 1U) == 0) {
          local_92 = (ushort)poStack_10->number;
          poStack_90 = poStack_10;
        }
        else {
          local_92 = 0;
          poStack_90 = poStack_20;
        }
      }
      else {
        local_92 = object_pack_total(player,poStack_10,false,&desc_target);
        if (local_92 == 0) {
          local_a0 = poStack_20;
        }
        else {
          local_a0 = poStack_10;
        }
        poStack_90 = local_a0;
      }
      object_desc(local_78,0x50,poStack_90,(uint)local_92 << 0x10 | 0x443,player);
      if (desc_target == (object *)0x0) {
        msg("You have %s (%c).",local_78,(ulong)(uint)(int)first._7_1_);
      }
      else {
        first._7_1_ = gear_to_label(player,desc_target);
        if (desc_target->number < local_92) {
          msg("You have %s (1st %c).",local_78,(ulong)(uint)(int)first._7_1_);
        }
        else {
          msg("You have %s (%c).",local_78,(ulong)(uint)(int)first._7_1_);
        }
      }
    }
    else {
      object_desc(local_78,0x50,poStack_20,0x13,player);
      msg("You no longer have the %s (%c).",local_78,(ulong)(uint)(int)first._7_1_);
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&stack0xffffffffffffffe0,L'\0',grid,false,true);
    if ((name[0x4d] & 1U) != 0) {
      sound(0x81);
    }
    event_signal(EVENT_INVENTORY);
    event_signal(EVENT_EQUIPMENT);
  }
  return;
}

Assistant:

void inven_drop(struct object *obj, int amt)
{
	struct object *dropped;
	bool none_left = false;
	bool equipped = false;
	bool quiver;

	char name[80];
	char label;

	/* Error check */
	if (amt <= 0)
		return;

	/* Check it is still held, in case there were two drop commands queued
	 * for this item.  This is in theory not ideal, but in practice should
	 * be safe. */
	if (!object_is_carried(player, obj))
		return;

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Is it in the quiver? */
	quiver = object_is_in_quiver(player, obj);

	/* Not too many */
	if (amt > obj->number) amt = obj->number;

	/* Take off equipment, don't combine */
	if (object_is_equipped(player->body, obj)) {
		equipped = true;
		inven_takeoff(obj);
	}

	/* Get the object */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe the dropped object */
	object_desc(name, sizeof(name), dropped, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s (%c).", name, label);

	/* Describe what's left */
	if (dropped->artifact) {
		object_desc(name, sizeof(name), dropped,
			ODESC_FULL | ODESC_SINGULAR, player);
		msg("You no longer have the %s (%c).", name, label);
	} else {
		struct object *first;
		struct object *desc_target;
		uint16_t total;

		/*
		 * Like gear_object_for_use(), don't show an aggregate total
		 * if it was equipped or the item has charges/recharging
		 * notice that is specific to the stack.
		 */
		if (equipped || tval_can_have_charges(obj) || tval_is_rod(obj)
				|| obj->timeout > 0) {
			first = NULL;
			if (none_left) {
				total = 0;
				desc_target = dropped;
			} else {
				total = obj->number;
				desc_target = obj;
			}
		} else {
			total = object_pack_total(player, obj, false, &first);
			desc_target = (total) ? obj : dropped;
		}

		object_desc(name, sizeof(name), desc_target,
			ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
			(total << 16), player);
		if (!first) {
			msg("You have %s (%c).", name, label);
		} else {
			label = gear_to_label(player, first);
			if (total > first->number) {
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		}
	}

	/* Drop it near the player */
	drop_near(cave, &dropped, 0, player->grid, false, true);

	/* Sound for quiver objects */
	if (quiver)
		sound(MSG_QUIVER);

	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}